

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testNumberOfNeighborsWithInvalidRange(void)

{
  bool bVar1;
  TypeUnion TVar2;
  Int64Parameter *pIVar3;
  Int64Range *pIVar4;
  UniformWeighting *this;
  NearestNeighborsIndex *pNVar5;
  SquaredEuclideanDistance *this_00;
  SingleKdTreeIndex *this_01;
  ostream *poVar6;
  int iVar7;
  Result res;
  Model m1;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  pointer local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  CoreML::KNNValidatorTests::generateInterface(&local_50);
  if (local_50._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    local_50.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_50.Type_;
  if (*(Int64Parameter **)
       &((local_50.Type_.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_ ==
      (Int64Parameter *)0x0) {
    pIVar3 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar3);
    (TVar2.knearestneighborsclassifier_)->numberofneighbors_ = pIVar3;
  }
  pIVar3 = (TVar2.knearestneighborsclassifier_)->numberofneighbors_;
  if (pIVar3->_oneof_case_[0] != 10) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
    pIVar3->_oneof_case_[0] = 10;
    pIVar4 = (Int64Range *)operator_new(0x28);
    CoreML::Specification::Int64Range::Int64Range(pIVar4);
    (pIVar3->AllowedValues_).range_ = pIVar4;
  }
  ((pIVar3->AllowedValues_).range_)->minvalue_ = -1;
  if (pIVar3->_oneof_case_[0] != 10) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
    pIVar3->_oneof_case_[0] = 10;
    pIVar4 = (Int64Range *)operator_new(0x28);
    CoreML::Specification::Int64Range::Int64Range(pIVar4);
    (pIVar3->AllowedValues_).range_ = pIVar4;
  }
  ((pIVar3->AllowedValues_).range_)->maxvalue_ = 10;
  pIVar3->defaultvalue_ = 5;
  if (((TVar2.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar2.knearestneighborsclassifier_);
    ((TVar2.supportvectorclassifier_)->rho_).total_size_ = 200;
    this = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_ + 1))->
    uniformweighting_ = this;
  }
  if ((NearestNeighborsIndex *)(TVar2.pipelineclassifier_)->pipeline_ ==
      (NearestNeighborsIndex *)0x0) {
    pNVar5 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(pNVar5);
    (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_ = pNVar5;
  }
  pNVar5 = (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (pNVar5->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(pNVar5);
    pNVar5->_oneof_case_[1] = 200;
    this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_00);
    (pNVar5->DistanceFunction_).squaredeuclideandistance_ = this_00;
  }
  if (pNVar5->_oneof_case_[0] != 0x6e) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(pNVar5);
    pNVar5->_oneof_case_[0] = 0x6e;
    this_01 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_01);
    (pNVar5->IndexType_).singlekdtreeindex_ = this_01;
  }
  ((pNVar5->IndexType_).linearindex_)->_cached_size_ = 0x1e;
  if ((TVar2.pipeline_)->_cached_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (TVar2.knearestneighborsclassifier_);
    (TVar2.pipeline_)->_cached_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_)->defaultint64label_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Default","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&((DefaultClassLabelUnion *)
              &(TVar2.bayesianprobitregressor_)->regressioninputfeaturename_)->defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  CoreML::validate<(MLModelType)404>((Result *)local_a0,&local_50);
  bVar1 = CoreML::Result::good((Result *)local_a0);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    if (pIVar3->_oneof_case_[0] != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
      pIVar3->_oneof_case_[0] = 10;
      pIVar4 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar4);
      (pIVar3->AllowedValues_).range_ = pIVar4;
    }
    ((pIVar3->AllowedValues_).range_)->minvalue_ = 0;
    if (pIVar3->_oneof_case_[0] != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
      pIVar3->_oneof_case_[0] = 10;
      pIVar4 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar4);
      (pIVar3->AllowedValues_).range_ = pIVar4;
    }
    ((pIVar3->AllowedValues_).range_)->maxvalue_ = 10;
    pIVar3->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)&local_78,&local_50);
    local_a0 = (undefined1  [8])local_78;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_a0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    else {
      if (pIVar3->_oneof_case_[0] != 10) {
        CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
        pIVar3->_oneof_case_[0] = 10;
        pIVar4 = (Int64Range *)operator_new(0x28);
        CoreML::Specification::Int64Range::Int64Range(pIVar4);
        (pIVar3->AllowedValues_).range_ = pIVar4;
      }
      ((pIVar3->AllowedValues_).range_)->minvalue_ = 10;
      if (pIVar3->_oneof_case_[0] != 10) {
        CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
        pIVar3->_oneof_case_[0] = 10;
        pIVar4 = (Int64Range *)operator_new(0x28);
        CoreML::Specification::Int64Range::Int64Range(pIVar4);
        (pIVar3->AllowedValues_).range_ = pIVar4;
      }
      ((pIVar3->AllowedValues_).range_)->maxvalue_ = 1;
      pIVar3->defaultvalue_ = 5;
      CoreML::validate<(MLModelType)404>((Result *)&local_78,&local_50);
      local_a0 = (undefined1  [8])local_78;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_a0);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                   ,0x6d);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        if (pIVar3->_oneof_case_[0] != 10) {
          CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
          pIVar3->_oneof_case_[0] = 10;
          pIVar4 = (Int64Range *)operator_new(0x28);
          CoreML::Specification::Int64Range::Int64Range(pIVar4);
          (pIVar3->AllowedValues_).range_ = pIVar4;
        }
        ((pIVar3->AllowedValues_).range_)->minvalue_ = -10;
        if (pIVar3->_oneof_case_[0] != 10) {
          CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
          pIVar3->_oneof_case_[0] = 10;
          pIVar4 = (Int64Range *)operator_new(0x28);
          CoreML::Specification::Int64Range::Int64Range(pIVar4);
          (pIVar3->AllowedValues_).range_ = pIVar4;
        }
        ((pIVar3->AllowedValues_).range_)->maxvalue_ = -5;
        pIVar3->defaultvalue_ = 5;
        CoreML::validate<(MLModelType)404>((Result *)&local_78,&local_50);
        local_a0 = (undefined1  [8])local_78;
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
        bVar1 = CoreML::Result::good((Result *)local_a0);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                     ,0x6d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x250);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
        else {
          if (pIVar3->_oneof_case_[0] != 10) {
            CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
            pIVar3->_oneof_case_[0] = 10;
            pIVar4 = (Int64Range *)operator_new(0x28);
            CoreML::Specification::Int64Range::Int64Range(pIVar4);
            (pIVar3->AllowedValues_).range_ = pIVar4;
          }
          ((pIVar3->AllowedValues_).range_)->minvalue_ = 1;
          if (pIVar3->_oneof_case_[0] != 10) {
            CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
            pIVar3->_oneof_case_[0] = 10;
            pIVar4 = (Int64Range *)operator_new(0x28);
            CoreML::Specification::Int64Range::Int64Range(pIVar4);
            (pIVar3->AllowedValues_).range_ = pIVar4;
          }
          ((pIVar3->AllowedValues_).range_)->maxvalue_ = 10;
          pIVar3->defaultvalue_ = 5;
          CoreML::validate<(MLModelType)404>((Result *)&local_78,&local_50);
          local_a0 = (undefined1  [8])local_78;
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
          }
          bVar1 = CoreML::Result::good((Result *)local_a0);
          iVar7 = 0;
          if (bVar1) goto LAB_001576e4;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                     ,0x6d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,600);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
      }
    }
  }
  std::ostream::put((char)poVar6);
  iVar7 = 1;
  std::ostream::flush();
LAB_001576e4:
  if (local_98._M_p != local_90 + 8) {
    operator_delete(local_98._M_p,local_90._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar7;
}

Assistant:

int testNumberOfNeighborsWithInvalidRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(-1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since range bounds should be > 0
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(0);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range bounds should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(10);
    numberOfNeighbors->mutable_range()->set_maxvalue(1);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since since range max should be > range min
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(-10);
    numberOfNeighbors->mutable_range()->set_maxvalue(-5);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range values must be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}